

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnLocalGetExpr
          (ExprVisitorDelegate *this,LocalGetExpr *expr)

{
  WatWriter *this_00;
  Info local_68;
  
  this_00 = this->writer_;
  Opcode::GetInfo(&local_68,(Opcode *)&Opcode::LocalGet_Opcode);
  WritePuts(this_00,local_68.name,Space);
  WriteVar(this->writer_,&expr->var,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnLocalGetExpr(LocalGetExpr* expr) {
  writer_->WritePutsSpace(Opcode::LocalGet_Opcode.GetName());
  writer_->WriteVar(expr->var, NextChar::Newline);
  return Result::Ok;
}